

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InsertionSort<int>(int *list,uint32 length,CompareVarsInfo *cvInfo)

{
  bool bVar1;
  int local_3c;
  uint local_38;
  int item;
  uint32 upperBound;
  uint32 insertPoint;
  uint32 lowerBound;
  uint32 sortedCount;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  CompareVarsInfo *cvInfo_local;
  int *piStack_10;
  uint32 length_local;
  int *list_local;
  
  _lowerBound = cvInfo->compareType;
  compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)cvInfo;
  cvInfo_local._4_4_ = length;
  piStack_10 = list;
  for (insertPoint = 1; insertPoint < cvInfo_local._4_4_; insertPoint = insertPoint + 1) {
    local_3c = piStack_10[insertPoint];
    local_38 = insertPoint;
    item = insertPoint - 1;
    upperBound = 0;
    while( true ) {
      bVar1 = (*_lowerBound)((CompareVarsInfo *)compareType,&local_3c,piStack_10 + (uint)item);
      if (bVar1) {
        local_38 = item;
      }
      else {
        upperBound = item + 1;
      }
      if (local_38 <= upperBound) break;
      item = upperBound + (local_38 - upperBound >> 1);
    }
    for (item = insertPoint; upperBound < (uint)item; item = item + -1) {
      piStack_10[(uint)item] = piStack_10[item - 1];
    }
    piStack_10[upperBound] = local_3c;
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }